

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ImVec2 in_RAX;
  ImDrawList *this;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ImVec2 local_38;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar6 = window->WasActive;
    uVar9 = (uint)(GImGui->NavWindow == window);
    local_38 = in_RAX;
    if (bVar6 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      bVar4 = TreeNodeEx(label,uVar9,"%s \'%s\'%s",label,window->Name," *Inactive*");
      PopStyleColor(1);
      IsItemHovered(0);
    }
    else {
      bVar4 = TreeNodeEx(label,uVar9,"%s \'%s\'%s",label,window->Name,"");
      bVar5 = IsItemHovered(0);
      if ((bVar5 & bVar6) == 1) {
        this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
        local_38.x = (window->Size).x + (window->Pos).x;
        local_38.y = (window->Size).y + (window->Pos).y;
        ImDrawList::AddRect(this,&window->Pos,&local_38,0xff00ffff,0.0,0,1.0);
      }
    }
    if (bVar4 != false) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar9 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar8 = "Child ";
      if ((uVar9 >> 0x18 & 1) == 0) {
        pcVar8 = "";
      }
      auVar21._0_4_ = -(uint)((uVar9 & 0x10000000) == 0);
      auVar21._4_4_ = -(uint)((uVar9 & 0x8000000) == 0);
      auVar21._8_4_ = -(uint)((uVar9 & 0x4000000) == 0);
      auVar21._12_4_ = -(uint)((uVar9 & 0x2000000) == 0);
      auVar20._0_4_ = -(uint)((uVar9 & 0x40) == 0);
      auVar20._4_4_ = -(uint)((uVar9 & 0x40000) == 0);
      auVar20._8_4_ = -(uint)((uVar9 & 0x200) == 0);
      auVar20._12_4_ = -(uint)((uVar9 & 0x100) == 0);
      auVar21 = packssdw(auVar20,auVar21);
      auVar21 = packsswb(auVar21,auVar21);
      pcVar7 = "Tooltip ";
      if ((auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar7 = "";
      }
      pcVar10 = "Popup ";
      if ((auVar21 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "";
      }
      pcVar12 = "Modal ";
      if ((auVar21 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar12 = "";
      }
      pcVar13 = "ChildMenu ";
      if ((auVar21 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar14 = "NoSavedSettings ";
      if ((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar18 = "NoMouseInputs";
      if ((auVar21 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      pcVar15 = "NoNavInputs";
      if ((auVar21 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar17 = "AlwaysAutoResize";
      if ((auVar21 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar9,pcVar8,pcVar7,pcVar10,pcVar12,
                 pcVar13,pcVar14,pcVar18,pcVar15,pcVar17);
      pcVar8 = "##X";
      if (window->ScrollbarX == false) {
        pcVar8 = " \t";
      }
      pcVar7 = "##Y";
      if (window->ScrollbarY == false) {
        pcVar7 = " \t";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar8 + 2,pcVar7 + 2);
      if ((window->Active != false) || (uVar11 = 0xffffffff, window->WasActive != false)) {
        uVar11 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar11)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar16 = 0;
      bVar6 = true;
      do {
        bVar4 = bVar6;
        fVar1 = window->NavRectRel[lVar16].Min.x;
        fVar2 = window->NavRectRel[lVar16].Min.y;
        fVar3 = window->NavRectRel[lVar16].Max.y;
        if ((fVar1 < fVar3) || (fVar2 < fVar3)) {
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2
                     ,(double)window->NavRectRel[lVar16].Max.x,(double)fVar3,lVar16,
                     (ulong)window->NavLastIds[lVar16]);
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",lVar16,(ulong)window->NavLastIds[lVar16]);
        }
        DebugLocateItemOnHover(window->NavLastIds[lVar16]);
        lVar16 = 1;
        bVar6 = false;
      } while (bVar4);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar8 = "NULL";
      }
      else {
        pcVar8 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar8);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar6 = TreeNode("Columns","Columns sets (%d)");
        if (bVar6) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar16 = 0;
            lVar19 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar16));
              lVar19 = lVar19 + 1;
              lVar16 = lVar16 + 0x88;
            } while (lVar19 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
        else
            BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        DebugLocateItemOnHover(window->NavLastIds[layer]);
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}